

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

Node * __thiscall Analyzer::extractAssignedExpression(Analyzer *this,Node *node)

{
  NodeType NVar1;
  TokenType TVar2;
  pointer ppNVar3;
  Node *pNVar4;
  ulong uVar5;
  
  do {
    NVar1 = node->nodeType;
    uVar5 = (ulong)NVar1;
    if (0x3c < uVar5) {
      return (Node *)0x0;
    }
    if ((0x1800000040000100U >> (uVar5 & 0x3f) & 1) == 0) {
      if (uVar5 == 0xf) goto LAB_00127358;
      if (uVar5 != 0x1d) {
        return (Node *)0x0;
      }
    }
    else {
      ppNVar3 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((8 < (ulong)((long)(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3)) &&
         (pNVar4 = ppNVar3[1], pNVar4 != (Node *)0x0)) {
        return pNVar4;
      }
      if (NVar1 != PNT_LOCAL_VAR_DECLARATION) {
        if (NVar1 != PNT_BINARY_OP) {
          return (Node *)0x0;
        }
LAB_00127358:
        TVar2 = node->tok->type;
        if ((TVar2 == TK_NEWSLOT) || (TVar2 == TK_ASSIGN)) {
          return (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
        }
        if (NVar1 != PNT_LOCAL_VAR_DECLARATION) {
          return (Node *)0x0;
        }
      }
    }
    ppNVar3 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish == ppNVar3) {
      return (Node *)0x0;
    }
    node = *ppNVar3;
  } while( true );
}

Assistant:

Node * extractAssignedExpression(Node * node)
  {
    if (node->nodeType == PNT_KEY_VALUE || node->nodeType == PNT_CLASS_MEMBER || node->nodeType == PNT_STATIC_CLASS_MEMBER ||
      node->nodeType == PNT_VAR_DECLARATOR)
    {
      if (node->children.size() > 1 && node->children[1])
        return node->children[1];
    }

    if (node->nodeType == PNT_BINARY_OP && (node->tok.type == TK_NEWSLOT || node->tok.type == TK_ASSIGN))
      return node->children[1];

    if (node->nodeType == PNT_LOCAL_VAR_DECLARATION && node->children.size() > 0)
      return extractAssignedExpression(node->children[0]);

    return nullptr;
  }